

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_continue(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  undefined4 *in_RSI;
  CTPNStmContinue *cont_stm;
  undefined8 in_stack_ffffffffffffffb8;
  CTcTokenizer *tok;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CTcTokenizer *this_00;
  CTcTokenizer *local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = (CTcTokenizer *)CTcPrsAllocObj::operator_new(0x269628);
  CTPNStmContinue::CTPNStmContinue
            ((CTPNStmContinue *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  this_00 = local_8;
  tVar1 = CTcTokenizer::next(local_8);
  if (tVar1 == TOKT_SYM) {
    tok = local_8;
    CTcTokenizer::getcur(G_tok);
    CTPNStmContinueBase::set_label
              ((CTPNStmContinueBase *)CONCAT44(tVar1,in_stack_ffffffffffffffc0),(CTcToken *)tok);
    CTcTokenizer::next(this_00);
  }
  else if ((1 < tVar1 - TOKT_LBRACE) && (tVar1 != TOKT_SEM)) {
    CTcTokenizer::log_error_curtok((CTcTokenizer *)CONCAT44(tVar1,in_stack_ffffffffffffffc0),iVar2);
  }
  iVar2 = parse_req_sem();
  if (iVar2 != 0) {
    *in_RSI = 1;
    local_8 = (CTcTokenizer *)0x0;
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_continue(int *err)
{
    CTPNStmContinue *cont_stm;

    /* create the 'break' statement */
    cont_stm = new CTPNStmContinue();

    /* skip the 'continue' keyword and check what follows */
    switch(G_tok->next())
    {
    case TOKT_SYM:
        /* set the label in the statement */
        cont_stm->set_label(G_tok->getcur());

        /* skip the label token */
        G_tok->next();
        break;

    case TOKT_SEM:
        /* keep going - we'll skip it in a moment */
        break;

    case TOKT_LBRACE:
    case TOKT_RBRACE:
        /* 
         *   they almost certainly simply left off the semicolon - don't
         *   bother with a "label expected" error, since the real error is
         *   most likely just "missing semicolon" 
         */
        break;

    default:
        /* log the error */
        G_tok->log_error_curtok(TCERR_CONT_REQ_LABEL);
        break;
    }

    /* parse the required terminating semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the 'continue' node */
    return cont_stm;
}